

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.c
# Opt level: O0

void string_buffer_append_string(string_buffer_t *sb,char *str)

{
  size_t __n;
  char *pcVar1;
  size_t len;
  char *str_local;
  string_buffer_t *sb_local;
  
  if (sb == (string_buffer_t *)0x0) {
    __assert_fail("sb != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                  ,0x18c,"void string_buffer_append_string(string_buffer_t *, const char *)");
  }
  if (str != (char *)0x0) {
    __n = strlen(str);
    while ((ulong)(long)sb->alloc <= sb->size + __n + 1) {
      sb->alloc = sb->alloc << 1;
      pcVar1 = (char *)realloc(sb->s,(long)sb->alloc);
      sb->s = pcVar1;
    }
    memcpy(sb->s + sb->size,str,__n);
    sb->size = __n + sb->size;
    sb->s[sb->size] = '\0';
    return;
  }
  __assert_fail("str != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                ,0x18d,"void string_buffer_append_string(string_buffer_t *, const char *)");
}

Assistant:

void string_buffer_append_string(string_buffer_t *sb, const char *str)
{
    assert(sb != NULL);
    assert(str != NULL);

    size_t len = strlen(str);

    while (sb->size+len + 1 >= sb->alloc) {
        sb->alloc *= 2;
        sb->s = realloc(sb->s, sb->alloc);
    }

    memcpy(&sb->s[sb->size], str, len);
    sb->size += len;
    sb->s[sb->size] = 0;
}